

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O0

void __thiscall HighsPrimalHeuristics::feasibilityPump(HighsPrimalHeuristics *this)

{
  value_type vVar1;
  int iVar2;
  Reason reason;
  bool bVar3;
  int64_t iVar4;
  HighsSolution *pHVar5;
  HighsDomain *other;
  pointer pHVar6;
  _Node_iterator_base<std::vector<int,_std::allocator<int>_>,_true> _Var7;
  reference piVar8;
  reference pvVar9;
  reference pvVar10;
  const_reference pvVar11;
  Highs *pHVar12;
  byte bVar13;
  long in_RDI;
  double dVar14;
  double dVar15;
  pair<std::__detail::_Node_iterator<std::vector<int,_std::allocator<int>_>,_true,_true>,_bool>
  pVar16;
  int64_t niters;
  HighsInt i_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  HighsInt col;
  HighsInt flippos;
  HighsInt i_1;
  HighsInt k;
  bool havecycle;
  double intval;
  HighsInt i;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  HighsDomain localdom;
  vector<int,_std::allocator<int>_> referencepoint;
  vector<double,_std::allocator<double>_> *lpsol;
  vector<double,_std::allocator<double>_> cost;
  vector<int,_std::allocator<int>_> mask;
  vector<int,_std::allocator<int>_> fracintset;
  vector<double,_std::allocator<double>_> fracintcost;
  Status status;
  vector<double,_std::allocator<double>_> roundedsol;
  unordered_set<std::vector<int,_std::allocator<int>_>,_HighsVectorHasher,_HighsVectorEqual,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  referencepoints;
  HighsLpRelaxation lprelax;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffa518;
  HighsLpRelaxation *in_stack_ffffffffffffa520;
  Highs *in_stack_ffffffffffffa528;
  pointer in_stack_ffffffffffffa530;
  size_type in_stack_ffffffffffffa538;
  undefined7 in_stack_ffffffffffffa540;
  undefined1 in_stack_ffffffffffffa547;
  double in_stack_ffffffffffffa548;
  undefined4 in_stack_ffffffffffffa550;
  HighsInt in_stack_ffffffffffffa554;
  HighsDomain *in_stack_ffffffffffffa558;
  HighsInt in_stack_ffffffffffffa560;
  Status in_stack_ffffffffffffa564;
  double in_stack_ffffffffffffa578;
  HighsLpRelaxation *in_stack_ffffffffffffa580;
  double in_stack_ffffffffffffa590;
  double in_stack_ffffffffffffa598;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa5a0;
  HighsMipSolverData *in_stack_ffffffffffffa5a8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa5b8;
  undefined6 in_stack_ffffffffffffa5c0;
  undefined1 in_stack_ffffffffffffa5c6;
  byte in_stack_ffffffffffffa5c7;
  HighsConflictPool *in_stack_ffffffffffffa5e8;
  HighsDomain *in_stack_ffffffffffffa5f0;
  undefined2 in_stack_ffffffffffffa628;
  undefined1 in_stack_ffffffffffffa62a;
  undefined1 in_stack_ffffffffffffa62b;
  int in_stack_ffffffffffffa62c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa630;
  Reason in_stack_ffffffffffffa638;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa648;
  double *in_stack_ffffffffffffa650;
  Highs *in_stack_ffffffffffffa658;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58e8;
  vector<int,_std::allocator<int>_> *local_58e0;
  int local_58d4;
  _Node_iterator_base<std::vector<int,_std::allocator<int>_>,_true> local_58d0;
  byte local_58c8;
  _Node_iterator_base<std::vector<int,_std::allocator<int>_>,_true> local_58c0;
  byte local_58b8;
  int local_58b0;
  int local_58ac;
  int local_58a8;
  int local_58a4;
  _Node_iterator_base<std::vector<int,_std::allocator<int>_>,_true> local_58a0;
  byte local_5898;
  _Node_iterator_base<std::vector<int,_std::allocator<int>_>,_true> local_5890;
  byte local_5888;
  byte local_587d;
  Reason local_587c;
  int local_5874;
  vector<double,_std::allocator<double>_> *local_5870;
  int local_5864;
  int *local_5860;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_5858;
  vector<int,_std::allocator<int>_> *local_5850;
  HighsDomain *in_stack_ffffffffffffa7b8;
  HighsDomain *in_stack_ffffffffffffa9b0;
  HighsLpRelaxation *in_stack_ffffffffffffa9b8;
  HighsLpRelaxation *in_stack_ffffffffffffa9d8;
  HighsLpRelaxation *in_stack_ffffffffffffa9e0;
  vector<double,_std::allocator<double>_> local_5540;
  vector<double,_std::allocator<double>_> local_5528;
  vector<int,_std::allocator<int>_> local_5510;
  vector<double,_std::allocator<double>_> *local_54f8;
  allocator local_54e9;
  string local_54e8 [39];
  allocator local_54c1;
  string local_54c0 [40];
  undefined8 local_5498;
  vector<double,_std::allocator<double>_> local_5490;
  undefined4 local_5474;
  Status local_5414;
  vector<double,_std::allocator<double>_> local_5410 [3];
  HighsLpRelaxation local_53c0;
  
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x674b9e);
  HighsLpRelaxation::HighsLpRelaxation(in_stack_ffffffffffffa9e0,in_stack_ffffffffffffa9d8);
  std::
  unordered_set<std::vector<int,_std::allocator<int>_>,_HighsVectorHasher,_HighsVectorEqual,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::unordered_set((unordered_set<std::vector<int,_std::allocator<int>_>,_HighsVectorHasher,_HighsVectorEqual,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)0x674bca);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x674bd7);
  local_5414 = HighsLpRelaxation::resolveLp(in_stack_ffffffffffffa9b8,in_stack_ffffffffffffa9b0);
  iVar4 = HighsLpRelaxation::getNumLpIterations(&local_53c0);
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + iVar4;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x674c3e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x674c4b);
  local_5474 = 1;
  std::allocator<int>::allocator((allocator<int> *)0x674c85);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffa547,in_stack_ffffffffffffa540),in_stack_ffffffffffffa538
             ,(value_type_conflict2 *)in_stack_ffffffffffffa530,
             (allocator_type *)in_stack_ffffffffffffa528);
  std::allocator<int>::~allocator((allocator<int> *)0x674cb9);
  local_5498 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x674cf4);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffa547,in_stack_ffffffffffffa540),in_stack_ffffffffffffa538
             ,(value_type_conflict1 *)in_stack_ffffffffffffa530,
             (allocator_type *)in_stack_ffffffffffffa528);
  std::allocator<double>::~allocator((allocator<double> *)0x674d28);
  HighsLpRelaxation::getLpSolver(&local_53c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_54c0,"simplex_strategy",&local_54c1);
  Highs::setOptionValue
            (in_stack_ffffffffffffa528,(string *)in_stack_ffffffffffffa520,
             (HighsInt)((ulong)in_stack_ffffffffffffa518 >> 0x20));
  std::__cxx11::string::~string(local_54c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_54c1);
  HighsLpRelaxation::setObjectiveLimit(in_stack_ffffffffffffa580,in_stack_ffffffffffffa578);
  HighsLpRelaxation::getLpSolver(&local_53c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_54e8,"primal_simplex_bound_perturbation_multiplier",&local_54e9);
  Highs::setOptionValue
            (in_stack_ffffffffffffa528,(string *)in_stack_ffffffffffffa520,
             (double)in_stack_ffffffffffffa518);
  std::__cxx11::string::~string(local_54e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_54e9);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x674e54);
  HighsLpRelaxation::setIterationLimit
            ((HighsLpRelaxation *)CONCAT44(in_stack_ffffffffffffa564,in_stack_ffffffffffffa560),
             (HighsInt)((ulong)in_stack_ffffffffffffa558 >> 0x20));
  do {
    HighsLpRelaxation::getFractionalIntegers(&local_53c0);
    bVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::empty
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       in_stack_ffffffffffffa530);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
LAB_00675d80:
      HighsLpRelaxation::getFractionalIntegers(&local_53c0);
      bVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::empty
                        ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )in_stack_ffffffffffffa530);
      if ((bVar3) && (bVar3 = HighsLpRelaxation::unscaledPrimalFeasible(local_5414), bVar3)) {
        in_stack_ffffffffffffa530 =
             std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x675ddd);
        pHVar12 = HighsLpRelaxation::getLpSolver(&local_53c0);
        Highs::getSolution(pHVar12);
        in_stack_ffffffffffffa520 =
             (HighsLpRelaxation *)HighsLpRelaxation::getObjective(&local_53c0);
        HighsMipSolverData::addIncumbent
                  (in_stack_ffffffffffffa5a8,in_stack_ffffffffffffa5a0,in_stack_ffffffffffffa598,
                   (int)((ulong)in_stack_ffffffffffffa590 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffa590 >> 0x18,0),
                   SUB81((ulong)in_stack_ffffffffffffa590 >> 0x10,0));
      }
      local_58d4 = 0;
LAB_00675e59:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa530);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa530);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa530);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa530);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa530);
      std::
      unordered_set<std::vector<int,_std::allocator<int>_>,_HighsVectorHasher,_HighsVectorEqual,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~unordered_set((unordered_set<std::vector<int,_std::allocator<int>_>,_HighsVectorHasher,_HighsVectorEqual,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)0x675ea7);
      HighsLpRelaxation::~HighsLpRelaxation(in_stack_ffffffffffffa520);
      return;
    }
    pHVar12 = HighsLpRelaxation::getLpSolver(&local_53c0);
    pHVar5 = Highs::getSolution(pHVar12);
    local_54f8 = &pHVar5->col_value;
    pHVar12 = HighsLpRelaxation::getLpSolver(&local_53c0);
    other = (HighsDomain *)Highs::getSolution(pHVar12);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffa5c7,
                        CONCAT16(in_stack_ffffffffffffa5c6,in_stack_ffffffffffffa5c0)),
               in_stack_ffffffffffffa5b8);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x674f4c);
    pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x674f63);
    std::vector<int,_std::allocator<int>_>::size(&pHVar6->integer_cols);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffa554,in_stack_ffffffffffffa550),
               (size_type)in_stack_ffffffffffffa548);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x674f9b)
    ;
    HighsDomain::HighsDomain((HighsDomain *)pHVar12,other);
    pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x674fcb);
    local_5850 = &pHVar6->integer_cols;
    local_5858._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffa518);
    local_5860 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffa518);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffa520,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffa518), bVar3) {
      piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_5858);
      local_5864 = *piVar8;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (local_5410,(long)local_5864);
      dVar15 = *pvVar10;
      dVar14 = HighsRandom::real((HighsRandom *)in_stack_ffffffffffffa530,
                                 (double)in_stack_ffffffffffffa528,(double)in_stack_ffffffffffffa520
                                );
      local_5870 = (vector<double,_std::allocator<double>_> *)floor(dVar15 + dVar14);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_5540,(long)local_5864);
      in_stack_ffffffffffffa658 = (Highs *)std::max<double>((double *)&local_5870,pvVar10);
      local_5870 = (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa658->_vptr_Highs
      ;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_5528,(long)local_5864);
      in_stack_ffffffffffffa650 = std::min<double>((double *)&local_5870,pvVar10);
      in_stack_ffffffffffffa648 =
           (vector<double,_std::allocator<double>_> *)*in_stack_ffffffffffffa650;
      local_5870 = in_stack_ffffffffffffa648;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (local_5410,(long)local_5864);
      *pvVar10 = (value_type)in_stack_ffffffffffffa648;
      local_5874 = (int)(double)local_5870;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa520,
                 (value_type_conflict2 *)in_stack_ffffffffffffa518);
      bVar3 = HighsDomain::infeasible((HighsDomain *)&stack0xffffffffffffa7b8);
      if (!bVar3) {
        in_stack_ffffffffffffa62c = local_5864;
        in_stack_ffffffffffffa630 = local_5870;
        in_stack_ffffffffffffa638 = HighsDomain::Reason::branching();
        reason.index = in_stack_ffffffffffffa564;
        reason.type = in_stack_ffffffffffffa560;
        local_587c = in_stack_ffffffffffffa638;
        HighsDomain::fixCol(in_stack_ffffffffffffa558,in_stack_ffffffffffffa554,
                            in_stack_ffffffffffffa548,reason);
        in_stack_ffffffffffffa62b = HighsDomain::infeasible((HighsDomain *)&stack0xffffffffffffa7b8)
        ;
        if ((bool)in_stack_ffffffffffffa62b) {
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x675256);
          HighsDomain::conflictAnalysis(in_stack_ffffffffffffa5f0,in_stack_ffffffffffffa5e8);
        }
        else {
          HighsDomain::propagate(in_stack_ffffffffffffa7b8);
          in_stack_ffffffffffffa62a =
               HighsDomain::infeasible((HighsDomain *)&stack0xffffffffffffa7b8);
          if ((bool)in_stack_ffffffffffffa62a) {
            std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
            operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                       0x67540c);
            HighsDomain::conflictAnalysis(in_stack_ffffffffffffa5f0,in_stack_ffffffffffffa5e8);
          }
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_5858);
    }
    pVar16 = std::
             unordered_set<std::vector<int,std::allocator<int>>,HighsVectorHasher,HighsVectorEqual,std::allocator<std::vector<int,std::allocator<int>>>>
             ::emplace<std::vector<int,std::allocator<int>>&>
                       ((unordered_set<std::vector<int,_std::allocator<int>_>,_HighsVectorHasher,_HighsVectorEqual,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)in_stack_ffffffffffffa530,
                        (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa528);
    _Var7._M_cur = (__node_type *)
                   pVar16.first.
                   super__Node_iterator_base<std::vector<int,_std::allocator<int>_>,_true>._M_cur;
    local_58a4 = 0;
    local_5898 = pVar16.second;
    local_58a0._M_cur = _Var7._M_cur;
    local_5890._M_cur = _Var7._M_cur;
    local_5888 = local_5898;
    bVar13 = local_5898;
    while (local_587d = (bVar13 ^ 0xff) & 1, local_587d != 0 && local_58a4 < 2) {
      for (local_58a8 = 0; local_58a8 != 10; local_58a8 = local_58a8 + 1) {
        pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x675530);
        std::vector<int,_std::allocator<int>_>::size(&pHVar6->integer_cols);
        local_58ac = HighsRandom::integer
                               ((HighsRandom *)in_stack_ffffffffffffa528,
                                (HighsInt)((ulong)in_stack_ffffffffffffa520 >> 0x20));
        pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x67557c);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&pHVar6->integer_cols,(long)local_58ac);
        local_58b0 = *pvVar9;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (local_5410,(long)local_58b0);
        dVar15 = *pvVar10;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            (local_54f8,(long)local_58b0);
        if (dVar15 < *pvVar11 || dVar15 == *pvVar11) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_5410,(long)local_58b0);
          dVar15 = *pvVar10;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_54f8,(long)local_58b0);
          if (*pvVar11 <= dVar15) {
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (local_5410,(long)local_58b0);
            in_stack_ffffffffffffa5e8 = (HighsConflictPool *)*pvVar10;
            pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x675714);
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&(pHVar6->domain).col_upper_,(long)local_58b0);
            if (*pvVar10 <= (double)in_stack_ffffffffffffa5e8) {
              pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x6757c2);
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&(pHVar6->domain).col_lower_,(long)local_58b0);
              vVar1 = *pvVar10;
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (local_5410,(long)local_58b0);
              *pvVar10 = vVar1;
            }
            else {
              pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x67575c);
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&(pHVar6->domain).col_upper_,(long)local_58b0);
              vVar1 = *pvVar10;
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (local_5410,(long)local_58b0);
              *pvVar10 = vVar1;
            }
          }
          else {
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (local_54f8,(long)local_58b0);
            dVar15 = ceil(*pvVar11);
            in_stack_ffffffffffffa5f0 = (HighsDomain *)(double)(int)dVar15;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (local_5410,(long)local_58b0);
            *pvVar10 = (value_type)in_stack_ffffffffffffa5f0;
          }
        }
        else {
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_54f8,(long)local_58b0);
          dVar15 = floor(*pvVar11);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_5410,(long)local_58b0);
          *pvVar10 = (double)(int)dVar15;
        }
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (local_5410,(long)local_58b0);
        dVar15 = *pvVar10;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_5510,(long)local_58ac);
        *pvVar9 = (int)dVar15;
      }
      pVar16 = std::
               unordered_set<std::vector<int,std::allocator<int>>,HighsVectorHasher,HighsVectorEqual,std::allocator<std::vector<int,std::allocator<int>>>>
               ::emplace<std::vector<int,std::allocator<int>>&>
                         ((unordered_set<std::vector<int,_std::allocator<int>_>,_HighsVectorHasher,_HighsVectorEqual,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)in_stack_ffffffffffffa530,
                          (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa528);
      local_58d0._M_cur =
           (__node_type *)
           pVar16.first.super__Node_iterator_base<std::vector<int,_std::allocator<int>_>,_true>.
           _M_cur;
      local_58a4 = local_58a4 + 1;
      in_stack_ffffffffffffa5c7 = pVar16.second;
      local_58c8 = in_stack_ffffffffffffa5c7;
      local_58c0._M_cur = local_58d0._M_cur;
      local_58b8 = in_stack_ffffffffffffa5c7;
      bVar13 = in_stack_ffffffffffffa5c7;
    }
    if (local_587d == 0) {
      in_stack_ffffffffffffa5c6 =
           linesearchRounding((HighsPrimalHeuristics *)in_stack_ffffffffffffa638,
                              in_stack_ffffffffffffa630,
                              (vector<double,_std::allocator<double>_> *)
                              CONCAT44(in_stack_ffffffffffffa62c,
                                       CONCAT13(in_stack_ffffffffffffa62b,
                                                CONCAT12(in_stack_ffffffffffffa62a,
                                                         in_stack_ffffffffffffa628))),
                              (int)((ulong)_Var7._M_cur >> 0x20));
      if ((bool)in_stack_ffffffffffffa5c6) {
        local_58d4 = 1;
      }
      else {
        in_stack_ffffffffffffa5b8 =
             (vector<double,_std::allocator<double>_> *)
             HighsLpRelaxation::getNumLpIterations(&local_53c0);
        dVar15 = (double)(long)in_stack_ffffffffffffa5b8;
        pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x675997);
        if (dVar15 < pHVar6->avgrootlpiters * 5.0 + 1000.0) {
          pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x6759ed);
          local_58e0 = &pHVar6->integer_cols;
          local_58e8._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffa518);
          std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffa518);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_ffffffffffffa520,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_ffffffffffffa518), bVar3) {
            piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_58e8);
            iVar2 = *piVar8;
            pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x675a73);
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&pHVar6->uplocks,(long)iVar2);
            if (*pvVar9 == 0) {
LAB_00675ac2:
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&local_5490,(long)iVar2);
              *pvVar10 = 0.0;
            }
            else {
              pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x675aa6);
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&pHVar6->downlocks,(long)iVar2);
              if (*pvVar9 == 0) goto LAB_00675ac2;
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (local_54f8,(long)iVar2);
              in_stack_ffffffffffffa5a8 = (HighsMipSolverData *)*pvVar11;
              pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (local_5410,(long)iVar2);
              in_stack_ffffffffffffa5a0 = (vector<double,_std::allocator<double>_> *)*pvVar10;
              pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     *)0x675b41);
              if ((double)in_stack_ffffffffffffa5a8 <=
                  (double)in_stack_ffffffffffffa5a0 - pHVar6->feastol) {
                dVar15 = HighsRandom::real((HighsRandom *)in_stack_ffffffffffffa530,
                                           (double)in_stack_ffffffffffffa528,
                                           (double)in_stack_ffffffffffffa520);
                dVar15 = dVar15 + 1.0;
                pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (&local_5490,(long)iVar2);
                *pvVar10 = dVar15;
              }
              else {
                in_stack_ffffffffffffa598 =
                     HighsRandom::real((HighsRandom *)in_stack_ffffffffffffa530,
                                       (double)in_stack_ffffffffffffa528,
                                       (double)in_stack_ffffffffffffa520);
                in_stack_ffffffffffffa590 = in_stack_ffffffffffffa598 + -1.0;
                pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (&local_5490,(long)iVar2);
                *pvVar10 = in_stack_ffffffffffffa590;
              }
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_58e8);
          }
          HighsLpRelaxation::getLpSolver(&local_53c0);
          std::vector<int,_std::allocator<int>_>::data
                    ((vector<int,_std::allocator<int>_> *)0x675c60);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x675c72);
          Highs::changeColsCost
                    (in_stack_ffffffffffffa658,(HighsInt *)in_stack_ffffffffffffa650,
                     (double *)in_stack_ffffffffffffa648);
          iVar4 = HighsLpRelaxation::getNumLpIterations(&local_53c0);
          in_stack_ffffffffffffa564 =
               HighsLpRelaxation::resolveLp(in_stack_ffffffffffffa9b8,in_stack_ffffffffffffa9b0);
          local_5414 = in_stack_ffffffffffffa564;
          in_stack_ffffffffffffa558 =
               (HighsDomain *)HighsLpRelaxation::getNumLpIterations(&local_53c0);
          if ((long)in_stack_ffffffffffffa558 - iVar4 == 0) {
            local_58d4 = 3;
          }
          else {
            *(long *)(in_RDI + 0x20) =
                 ((long)in_stack_ffffffffffffa558 - iVar4) + *(long *)(in_RDI + 0x20);
            local_58d4 = 0;
          }
        }
        else {
          local_58d4 = 3;
        }
      }
    }
    else {
      local_58d4 = 1;
    }
    HighsDomain::~HighsDomain((HighsDomain *)in_stack_ffffffffffffa520);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa530);
    if (local_58d4 != 0) {
      if (local_58d4 != 3) goto LAB_00675e59;
      goto LAB_00675d80;
    }
    in_stack_ffffffffffffa554 = 0;
  } while( true );
}

Assistant:

void HighsPrimalHeuristics::feasibilityPump() {
  HighsLpRelaxation lprelax(mipsolver.mipdata_->lp);
  std::unordered_set<std::vector<HighsInt>, HighsVectorHasher, HighsVectorEqual>
      referencepoints;
  std::vector<double> roundedsol;
  HighsLpRelaxation::Status status = lprelax.resolveLp();
  lp_iterations += lprelax.getNumLpIterations();

  std::vector<double> fracintcost;
  std::vector<HighsInt> fracintset;

  std::vector<HighsInt> mask(mipsolver.model_->num_col_, 1);
  std::vector<double> cost(mipsolver.model_->num_col_, 0.0);

  lprelax.getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyPrimal);
  lprelax.setObjectiveLimit();
  lprelax.getLpSolver().setOptionValue(
      "primal_simplex_bound_perturbation_multiplier", 0.0);

  lprelax.setIterationLimit(5 * mipsolver.mipdata_->avgrootlpiters);

  while (!lprelax.getFractionalIntegers().empty()) {
    const auto& lpsol = lprelax.getLpSolver().getSolution().col_value;
    roundedsol = lprelax.getLpSolver().getSolution().col_value;

    std::vector<HighsInt> referencepoint;
    referencepoint.reserve(mipsolver.mipdata_->integer_cols.size());

    auto localdom = mipsolver.mipdata_->domain;
    for (HighsInt i : mipsolver.mipdata_->integer_cols) {
      assert(mipsolver.variableType(i) == HighsVarType::kInteger);
      double intval = std::floor(roundedsol[i] + randgen.real(0.4, 0.6));
      intval = std::max(intval, localdom.col_lower_[i]);
      intval = std::min(intval, localdom.col_upper_[i]);
      roundedsol[i] = intval;
      referencepoint.push_back((HighsInt)intval);
      if (!localdom.infeasible()) {
        localdom.fixCol(i, intval, HighsDomain::Reason::branching());
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          continue;
        }
        localdom.propagate();
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          continue;
        }
      }
    }

    bool havecycle = !referencepoints.emplace(referencepoint).second;
    for (HighsInt k = 0; havecycle && k < 2; ++k) {
      for (HighsInt i = 0; i != 10; ++i) {
        HighsInt flippos =
            randgen.integer(mipsolver.mipdata_->integer_cols.size());
        HighsInt col = mipsolver.mipdata_->integer_cols[flippos];
        if (roundedsol[col] > lpsol[col])
          roundedsol[col] = (HighsInt)std::floor(lpsol[col]);
        else if (roundedsol[col] < lpsol[col])
          roundedsol[col] = (HighsInt)std::ceil(lpsol[col]);
        else if (roundedsol[col] < mipsolver.mipdata_->domain.col_upper_[col])
          roundedsol[col] = mipsolver.mipdata_->domain.col_upper_[col];
        else
          roundedsol[col] = mipsolver.mipdata_->domain.col_lower_[col];

        referencepoint[flippos] = (HighsInt)roundedsol[col];
      }
      havecycle = !referencepoints.emplace(referencepoint).second;
    }

    if (havecycle) return;

    if (linesearchRounding(lpsol, roundedsol, kSolutionSourceFeasibilityPump))
      return;

    if (lprelax.getNumLpIterations() >=
        1000 + mipsolver.mipdata_->avgrootlpiters * 5)
      break;

    for (HighsInt i : mipsolver.mipdata_->integer_cols) {
      assert(mipsolver.variableType(i) == HighsVarType::kInteger);

      if (mipsolver.mipdata_->uplocks[i] == 0 ||
          mipsolver.mipdata_->downlocks[i] == 0)
        cost[i] = 0.0;
      else if (lpsol[i] > roundedsol[i] - mipsolver.mipdata_->feastol)
        cost[i] = -1.0 + randgen.real(-1e-4, 1e-4);
      else
        cost[i] = 1.0 + randgen.real(-1e-4, 1e-4);
    }

    lprelax.getLpSolver().changeColsCost(mask.data(), cost.data());
    int64_t niters = -lprelax.getNumLpIterations();
    status = lprelax.resolveLp();
    niters += lprelax.getNumLpIterations();
    if (niters == 0) break;
    lp_iterations += niters;
  }

  if (lprelax.getFractionalIntegers().empty() &&
      lprelax.unscaledPrimalFeasible(status))
    mipsolver.mipdata_->addIncumbent(
        lprelax.getLpSolver().getSolution().col_value, lprelax.getObjective(),
        kSolutionSourceFeasibilityPump);
}